

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall TPZFrontSym<double>::Reset(TPZFrontSym<double> *this,int64_t GlobalSize)

{
  TPZVec<long> *this_00;
  long local_20;
  
  TPZVec<double>::Resize(&(this->super_TPZFront<double>).fData,0);
  TPZManVector<int,_10>::Resize(&(this->super_TPZFront<double>).fFree.super_TPZManVector<int,_10>,0)
  ;
  (this->super_TPZFront<double>).fFront = 0;
  TPZManVector<long,_10>::Resize(&(this->super_TPZFront<double>).fGlobal,0);
  this_00 = &(this->super_TPZFront<double>).fLocal;
  TPZVec<long>::Resize(this_00,GlobalSize);
  local_20 = -1;
  TPZVec<long>::Fill(this_00,&local_20,0,-1);
  (this->super_TPZFront<double>).fMaxFront = 0;
  return;
}

Assistant:

void TPZFrontSym<TVar>::Reset(int64_t GlobalSize)
{
	this->fData.Resize(0);
	this->fFree.Resize(0);
	this->fFront=0;
	this->fGlobal.Resize(0);
	this->fLocal.Resize(GlobalSize);
	this->fLocal.Fill(-1);
	this->fMaxFront=0;
}